

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::AuxiliaryContext
          (ByteCodeWriter *this,OpCode op,RegSlot destinationRegister,void *buffer,int byteCount,
          RegSlot C1)

{
  RegSlot RVar1;
  uint local_4c;
  RegSlot local_48;
  OpLayoutAuxiliary data;
  
  data._4_8_ = buffer;
  CheckOpen(this);
  RVar1 = ConsumeReg(this,destinationRegister);
  local_48 = ConsumeReg(this,C1);
  local_4c = (this->m_auxContextData).currentOffset;
  if (0 < byteCount) {
    Data::Encode(&this->m_auxContextData,(void *)data._4_8_,byteCount);
  }
  data.super_OpLayoutAuxNoReg.Offset = RVar1;
  Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,&local_4c,0xc,this);
  return;
}

Assistant:

void ByteCodeWriter::AuxiliaryContext(OpCode op, RegSlot destinationRegister, const void* buffer, int byteCount, Js::RegSlot C1)
    {
        CheckOpen();
        destinationRegister = ConsumeReg(destinationRegister);
        C1 = ConsumeReg(C1);

        //
        // Write the buffer's contents
        //

        int currentOffset = m_auxContextData.GetCurrentOffset();
        if (byteCount > 0)
        {
            m_auxContextData.Encode(buffer, byteCount);
        }

        //
        // Write OpCode to create new auxiliary data
        //

        OpLayoutAuxiliary data;
        data.R0 = destinationRegister;
        data.Offset = currentOffset;
        data.C1 = C1;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
    }